

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O1

void __thiscall xLearn::DMatrix::Deserialize(DMatrix *this,string *filename)

{
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  *this_00;
  FILE *file;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  ostream *poVar2;
  ulong uVar3;
  Logger local_6c;
  undefined1 local_68 [32];
  string local_48;
  
  if (filename->_M_string_length != 0) {
    Reset(this);
    file = OpenFileOrDie((filename->_M_dataplus)._M_p,"r");
    ReadDataFromDisk(file,(char *)this,8);
    ReadDataFromDisk(file,(char *)&this->hash_value_2,8);
    ReadDataFromDisk(file,(char *)&this->row_length,4);
    this_00 = &this->row;
    local_68._0_8_ = (value_type)0x0;
    std::
    vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    ::resize(this_00,(ulong)this->row_length,(value_type *)local_68);
    if (this->row_length != 0) {
      uVar3 = 0;
      do {
        pvVar1 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)operator_new(0x18);
        (pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
        super__Vector_impl_data._M_start = 0;
        *(pointer *)
         ((long)&(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                 super__Vector_impl_data + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                 super__Vector_impl_data + 0x10) = (pointer)0x0;
        (this_00->
        super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar3] = pvVar1;
        ReadVectorFromFile<xLearn::Node>
                  (file,(this_00->
                        super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->row_length);
    }
    ReadVectorFromFile<float>(file,&this->Y);
    ReadVectorFromFile<float>(file,&this->norm);
    ReadDataFromDisk(file,&this->has_label,1);
    ReadDataFromDisk(file,(char *)&this->pos,4);
    Close(file);
    return;
  }
  local_6c.severity_ = ERR;
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
             ,"");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Deserialize","");
  poVar2 = Logger::Start(ERR,(string *)local_68,0x16d,&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK failed ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x16d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"!filename.empty()",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)local_68);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

void Deserialize(const std::string& filename) {
    CHECK(!filename.empty());
    this->Reset();
#ifndef _MSC_VER
    FILE* file = OpenFileOrDie(filename.c_str(), "r");
#else
    FILE* file = OpenFileOrDie(filename.c_str(), "rb");
#endif
    // Read hash_value
    ReadDataFromDisk(file, (char*)&hash_value_1, sizeof(hash_value_1));
    ReadDataFromDisk(file, (char*)&hash_value_2, sizeof(hash_value_2));
    // Read row_length
    ReadDataFromDisk(file, (char*)&row_length, sizeof(row_length));
    CHECK_GE(row_length, 0);
    // Read row
    row.resize(row_length, nullptr);
    for (size_t i = 0; i < row_length; ++i) {
      row[i] = new SparseRow;
      ReadVectorFromFile(file, *(row[i]));
    }
    // Read Y
    ReadVectorFromFile(file, Y);
    // Read norm
    ReadVectorFromFile(file, norm);
    // Read has label
    ReadDataFromDisk(file, (char*)&has_label, sizeof(has_label));
    // Read pos
    ReadDataFromDisk(file, (char*)&pos, sizeof(pos));
    Close(file);
  }